

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_0::Texture2DBaseLevelTestInstance::getReferenceParams
          (Texture2DBaseLevelTestInstance *this,ReferenceParams *params,int cellNdx)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->super_Texture2DLodControlTestInstance).m_texWidth;
  uVar3 = (this->super_Texture2DLodControlTestInstance).m_texHeight;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar3 = ((uint)cellNdx >> 0x10 ^ cellNdx ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  dVar1 = deStringHash((this->m_testParam).super_TextureMipmapCommonTestCaseParameters.minFilterName
                      );
  params->baseLevel = (dVar1 ^ uVar3 ^ uVar3 >> 0xf ^ 0xac2f274a) % (0x20 - uVar2);
  return;
}

Assistant:

int getBaseLevel (int cellNdx) const
	{
		const int	numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;
		const int	baseLevel	= (deInt32Hash(cellNdx) ^ deStringHash(m_testParam.minFilterName) ^ 0xac2f274a) % numLevels;

		return baseLevel;
	}